

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  bool bVar1;
  cmake *pcVar2;
  __type _Var3;
  long lVar4;
  ostream *poVar5;
  pointer pcVar6;
  const_iterator i;
  pointer filename;
  pointer pcVar7;
  string local_228;
  char *local_208 [4];
  string temp;
  string local_1c8;
  ostringstream msg;
  
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  GetExecutionFilePath_abi_cxx11_(&local_228,this);
  cmsys::SystemTools::GetFilenameName(&local_1c8,&local_228);
  filename = (pcVar2->TraceOnlyThisSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (filename !=
      (pcVar2->TraceOnlyThisSources).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _Var3 = false;
    while (_Var3 == false) {
      if (filename ==
          (pcVar2->TraceOnlyThisSources).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002be434;
      lVar4 = std::__cxx11::string::rfind((string *)&local_228,(ulong)filename);
      if ((lVar4 == -1) || (lVar4 + filename->_M_string_length != local_228._M_string_length)) {
        _Var3 = false;
      }
      else {
        cmsys::SystemTools::GetFilenameName((string *)&msg,filename);
        _Var3 = std::operator==(&local_1c8,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
      }
      filename = filename + 1;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar5 = std::operator<<((ostream *)&msg,(string *)&local_228);
  poVar5 = std::operator<<(poVar5,"(");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::operator<<(poVar5,"):  ");
  poVar5 = std::operator<<((ostream *)&msg,(string *)lff);
  std::operator<<(poVar5,"(");
  bVar1 = this->GlobalGenerator->CMakeInstance->TraceExpand;
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  for (pcVar7 = (lff->Arguments).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar7 != (lff->Arguments).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_finish; pcVar7 = pcVar7 + 1) {
    pcVar6 = pcVar7;
    if (bVar1 != false) {
      std::__cxx11::string::_M_assign((string *)&temp);
      ExpandVariablesInString(this,&temp);
      pcVar6 = (pointer)&temp;
    }
    std::operator<<((ostream *)&msg,(string *)pcVar6);
    std::operator<<((ostream *)&msg," ");
  }
  std::operator<<((ostream *)&msg,")");
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message(local_208[0],(char *)0x0);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)&temp);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
LAB_002be434:
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_228);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = this->GetExecutionFilePath();
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::vector<std::string>::const_iterator i =
           trace_only_this_files.begin();
         !trace && i != trace_only_this_files.end(); ++i) {
      std::string::size_type const pos = full_path.rfind(*i);
      trace = (pos != std::string::npos) &&
        ((pos + i->size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(*i));
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  msg << full_path << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for (std::vector<cmListFileArgument>::const_iterator i =
         lff.Arguments.begin();
       i != lff.Arguments.end(); ++i) {
    if (expand) {
      temp = i->Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
    } else {
      msg << i->Value;
    }
    msg << " ";
  }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}